

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
ProfiledGetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>>const__unaligned,false,true,false>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout,Var instance)

{
  ushort uVar1;
  PropertyId propertyId_00;
  InlineCache *inlineCache;
  FunctionBody *functionBody;
  Var value_00;
  Var value;
  PropertyId propertyId;
  Var instance_local;
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  propertyId_00 = GetPropertyIdFromCacheId(this,(uint)playout->inlineCacheIndex);
  inlineCache = GetInlineCache(this,(uint)playout->inlineCacheIndex);
  uVar1 = playout->inlineCacheIndex;
  functionBody = GetFunctionBody(this);
  value_00 = ProfilingHelpers::ProfiledLdFld<false,true,false>
                       (instance,propertyId_00,inlineCache,(uint)uVar1,functionBody,instance);
  SetReg<unsigned_short>(this,playout->Value,value_00);
  return;
}

Assistant:

void InterpreterStackFrame::ProfiledGetProperty(unaligned T* playout, const Var instance)
    {
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        Var value = ProfilingHelpers::ProfiledLdFld<Root, Method, CallApplyTarget>(
            instance,
            propertyId,
            GetInlineCache(playout->inlineCacheIndex),
            playout->inlineCacheIndex,
            GetFunctionBody(),
            instance);

        SetReg(playout->Value, value);

#ifdef TELEMETRY_INTERPRETER
        if (TELEMETRY_PROPERTY_OPCODE_FILTER(propertyId))
        {
            // `successful` will be true as PatchGetRootValue throws an exception if not found.
            this->scriptContext->GetTelemetry().GetOpcodeTelemetry().GetProperty(instance, propertyId, value, /*successful:*/true);
        }
#endif
    }